

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::Q_from_AngAxis
          (ChQuaternion<double> *__return_storage_ptr__,double angle,ChVector<double> *axis)

{
  double dVar1;
  double dVar2;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  dVar1 = sin(angle * 0.5);
  dVar2 = cos(angle * 0.5);
  __return_storage_ptr__->m_data[0] = dVar2;
  __return_storage_ptr__->m_data[1] = dVar1 * axis->m_data[0];
  __return_storage_ptr__->m_data[2] = dVar1 * axis->m_data[1];
  __return_storage_ptr__->m_data[3] = dVar1 * axis->m_data[2];
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Q_from_AngAxis(double angle, const ChVector<double>& axis) {
    ChQuaternion<double> quat;
    double halfang;
    double sinhalf;

    halfang = (angle * 0.5);
    sinhalf = sin(halfang);

    quat.e0() = cos(halfang);
    quat.e1() = axis.x() * sinhalf;
    quat.e2() = axis.y() * sinhalf;
    quat.e3() = axis.z() * sinhalf;
    return (quat);
}